

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdAdaptEcdsaAdaptor(void *handle,char *adaptor_signature,char *adaptor_secret,char **signature)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_ba;
  allocator local_b9;
  undefined1 local_b8 [32];
  Privkey local_98;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  ByteData sig;
  string local_48;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(adaptor_signature);
  if (bVar1) {
    local_b8._0_8_ = "cfdcapi_key.cpp";
    local_b8._8_4_ = 0x115;
    local_b8._16_8_ = "CfdAdaptEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_b8,"adaptor_signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_b8,"Failed to parameter. adaptor_signature is null or empty.",
               (allocator *)&local_98);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor_secret);
  if (!bVar1) {
    if (signature != (char **)0x0) {
      std::__cxx11::string::string((string *)local_b8,adaptor_signature,&local_b9);
      cfd::core::AdaptorSignature::AdaptorSignature
                ((AdaptorSignature *)&local_78,(string *)local_b8);
      std::__cxx11::string::string((string *)&local_48,adaptor_secret,&local_ba);
      cfd::core::Privkey::Privkey(&local_98,&local_48,kMainnet,true);
      cfd::core::AdaptorUtil::Adapt(&sig,(AdaptorSignature *)&local_78,&local_98);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
      std::__cxx11::string::~string((string *)&local_48);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
      std::__cxx11::string::~string((string *)local_b8);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_b8,&sig);
      pcVar2 = cfd::capi::CreateString((string *)local_b8);
      *signature = pcVar2;
      std::__cxx11::string::~string((string *)local_b8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
      return 0;
    }
    local_b8._0_8_ = "cfdcapi_key.cpp";
    local_b8._8_4_ = 0x121;
    local_b8._16_8_ = "CfdAdaptEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_b8,"signature is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_b8,"Failed to parameter. signature is null.",(allocator *)&local_98);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b8._0_8_ = "cfdcapi_key.cpp";
  local_b8._8_4_ = 0x11b;
  local_b8._16_8_ = "CfdAdaptEcdsaAdaptor";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_b8,"adaptor_secret is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_b8,"Failed to parameter. adaptor_secret is null or empty.",
             (allocator *)&local_98);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_b8);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAdaptEcdsaAdaptor(
    void* handle, const char* adaptor_signature, const char* adaptor_secret,
    char** signature) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(adaptor_signature)) {
      warn(CFD_LOG_SOURCE, "adaptor_signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_signature is null or empty.");
    }
    if (IsEmptyString(adaptor_secret)) {
      warn(CFD_LOG_SOURCE, "adaptor_secret is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor_secret is null or empty.");
    }
    if (signature == nullptr) {
      warn(CFD_LOG_SOURCE, "signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null.");
    }

    ByteData sig = AdaptorUtil::Adapt(
        AdaptorSignature(adaptor_signature), Privkey(adaptor_secret));

    *signature = CreateString(sig.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}